

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_enum.cc
# Opt level: O3

void init_enum(module *m)

{
  PyObject *pPVar1;
  handle hVar2;
  enum_<kratos::PortType> *peVar3;
  enum_<kratos::PortDirection> *peVar4;
  enum_<kratos::HashStrategy> *peVar5;
  enum_<kratos::StatementType> *peVar6;
  enum_<kratos::AssignmentType> *peVar7;
  enum_<kratos::StatementBlockType> *peVar8;
  enum_<kratos::EventEdgeType> *peVar9;
  enum_<kratos::IRNodeKind> *peVar10;
  enum_<kratos::VarCastType> *peVar11;
  enum_<kratos::PropertyAction> *peVar12;
  enum_<kratos::ParamType> *peVar13;
  enum_<kratos::EventActionType> *peVar14;
  enum_<kratos::EventControl::DelaySide> *this;
  object local_68;
  unique_function_record local_60;
  handle local_58;
  cpp_function local_50;
  cpp_function cf;
  
  pybind11::enum_<kratos::PortType>::enum_<>((enum_<kratos::PortType> *)&cf,(handle *)m,"PortType");
  peVar3 = pybind11::enum_<kratos::PortType>::value
                     ((enum_<kratos::PortType> *)&cf,"Clock",Clock,(char *)0x0);
  peVar3 = pybind11::enum_<kratos::PortType>::value(peVar3,"AsyncReset",AsyncReset,(char *)0x0);
  peVar3 = pybind11::enum_<kratos::PortType>::value(peVar3,"ClockEnable",ClockEnable,(char *)0x0);
  peVar3 = pybind11::enum_<kratos::PortType>::value(peVar3,"Data",Data,(char *)0x0);
  peVar3 = pybind11::enum_<kratos::PortType>::value(peVar3,"Reset",Reset,(char *)0x0);
  pybind11::detail::enum_base::export_values(&peVar3->m_base);
  pybind11::object::~object((object *)&cf);
  pybind11::enum_<kratos::PortDirection>::enum_<>
            ((enum_<kratos::PortDirection> *)&cf,(handle *)m,"PortDirection");
  peVar4 = pybind11::enum_<kratos::PortDirection>::value
                     ((enum_<kratos::PortDirection> *)&cf,"In",In,(char *)0x0);
  peVar4 = pybind11::enum_<kratos::PortDirection>::value(peVar4,"Out",Out,(char *)0x0);
  peVar4 = pybind11::enum_<kratos::PortDirection>::value(peVar4,"InOut",InOut,(char *)0x0);
  pybind11::detail::enum_base::export_values(&peVar4->m_base);
  pybind11::object::~object((object *)&cf);
  pybind11::enum_<kratos::HashStrategy>::enum_<>
            ((enum_<kratos::HashStrategy> *)&cf,(handle *)m,"HashStrategy");
  peVar5 = pybind11::enum_<kratos::HashStrategy>::value
                     ((enum_<kratos::HashStrategy> *)&cf,"SequentialHash",SequentialHash,(char *)0x0
                     );
  peVar5 = pybind11::enum_<kratos::HashStrategy>::value
                     (peVar5,"ParallelHash",ParallelHash,(char *)0x0);
  pybind11::detail::enum_base::export_values(&peVar5->m_base);
  pybind11::object::~object((object *)&cf);
  pybind11::enum_<kratos::StatementType>::enum_<>
            ((enum_<kratos::StatementType> *)&cf,(handle *)m,"StatementType");
  peVar6 = pybind11::enum_<kratos::StatementType>::value
                     ((enum_<kratos::StatementType> *)&cf,"If",If,(char *)0x0);
  peVar6 = pybind11::enum_<kratos::StatementType>::value(peVar6,"Switch",Switch,(char *)0x0);
  peVar6 = pybind11::enum_<kratos::StatementType>::value(peVar6,"Assign",Assign,(char *)0x0);
  peVar6 = pybind11::enum_<kratos::StatementType>::value(peVar6,"Block",Block,(char *)0x0);
  peVar6 = pybind11::enum_<kratos::StatementType>::value
                     (peVar6,"ModuleInstantiation",ModuleInstantiation,(char *)0x0);
  pybind11::detail::enum_base::export_values(&peVar6->m_base);
  pybind11::object::~object((object *)&cf);
  pybind11::enum_<kratos::AssignmentType>::enum_<>
            ((enum_<kratos::AssignmentType> *)&cf,(handle *)m,"AssignmentType");
  peVar7 = pybind11::enum_<kratos::AssignmentType>::value
                     ((enum_<kratos::AssignmentType> *)&cf,"Blocking",Blocking,(char *)0x0);
  peVar7 = pybind11::enum_<kratos::AssignmentType>::value
                     (peVar7,"NonBlocking",NonBlocking,(char *)0x0);
  peVar7 = pybind11::enum_<kratos::AssignmentType>::value(peVar7,"Undefined",Undefined,(char *)0x0);
  pybind11::detail::enum_base::export_values(&peVar7->m_base);
  pybind11::object::~object((object *)&cf);
  pybind11::enum_<kratos::StatementBlockType>::enum_<>
            ((enum_<kratos::StatementBlockType> *)&cf,(handle *)m,"StatementBlockType");
  peVar8 = pybind11::enum_<kratos::StatementBlockType>::value
                     ((enum_<kratos::StatementBlockType> *)&cf,"Combinational",Combinational,
                      (char *)0x0);
  peVar8 = pybind11::enum_<kratos::StatementBlockType>::value
                     (peVar8,"Sequential",Sequential,(char *)0x0);
  peVar8 = pybind11::enum_<kratos::StatementBlockType>::value(peVar8,"Initial",Initial,(char *)0x0);
  peVar8 = pybind11::enum_<kratos::StatementBlockType>::value(peVar8,"Latch",Latch,(char *)0x0);
  peVar8 = pybind11::enum_<kratos::StatementBlockType>::value(peVar8,"Final",Final,(char *)0x0);
  pybind11::detail::enum_base::export_values(&peVar8->m_base);
  pybind11::object::~object((object *)&cf);
  pybind11::enum_<kratos::EventEdgeType>::enum_<>
            ((enum_<kratos::EventEdgeType> *)&cf,(handle *)m,"EventEdgeType");
  peVar9 = pybind11::enum_<kratos::EventEdgeType>::value
                     ((enum_<kratos::EventEdgeType> *)&cf,"Posedge",Posedge,(char *)0x0);
  peVar9 = pybind11::enum_<kratos::EventEdgeType>::value(peVar9,"Negedge",Negedge,(char *)0x0);
  pPVar1 = (peVar9->super_class_<kratos::EventEdgeType>).super_generic_type.super_object.
           super_handle.m_ptr;
  local_68.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_58.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__call__");
  if (local_58.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_58.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  hVar2.m_ptr = local_58.m_ptr;
  local_50.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_60);
  *(code **)((long)local_60._M_t.
                   super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<init_enum(pybind11::module_&)::$_0,std::shared_ptr<kratos::EventDelayStmt>,kratos::EventEdgeType,kratos::Var&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_enum(pybind11::module_&)::$_0&&,std::shared_ptr<kratos::EventDelayStmt>(*)(kratos::EventEdgeType,kratos::Var&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_60._M_t.
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       "__call__";
  *(byte *)((long)local_60._M_t.
                  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x59) =
       *(byte *)((long)local_60._M_t.
                       super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                       _M_head_impl + 0x59) | 0x10;
  ((handle *)
  ((long)local_60._M_t.
         super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70))->
  m_ptr = pPVar1;
  ((handle *)
  ((long)local_60._M_t.
         super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78))->
  m_ptr = hVar2.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&local_50,&local_60,
             pybind11::cpp_function::
             initialize<init_enum(pybind11::module_&)::$_0,std::shared_ptr<kratos::EventDelayStmt>,kratos::EventEdgeType,kratos::Var&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_enum(pybind11::module_&)::$_0&&,std::shared_ptr<kratos::EventDelayStmt>(*)(kratos::EventEdgeType,kratos::Var&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<init_enum(pybind11::module_&)::$_0,std::shared_ptr<kratos::EventDelayStmt>,kratos::EventEdgeType,kratos::Var&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_enum(pybind11::module_&)::$_0&&,std::shared_ptr<kratos::EventDelayStmt>(*)(kratos::EventEdgeType,kratos::Var&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr(&local_60);
  pybind11::object::~object((object *)&local_58);
  pybind11::object::~object(&local_68);
  pybind11::detail::add_class_method((object *)peVar9,"__call__",&local_50);
  pybind11::object::~object((object *)&local_50);
  pybind11::object::~object((object *)&cf);
  pybind11::enum_<kratos::IRNodeKind>::enum_<>
            ((enum_<kratos::IRNodeKind> *)&cf,(handle *)m,"IRNodeKind");
  peVar10 = pybind11::enum_<kratos::IRNodeKind>::value
                      ((enum_<kratos::IRNodeKind> *)&cf,"GeneratorKind",GeneratorKind,(char *)0x0);
  peVar10 = pybind11::enum_<kratos::IRNodeKind>::value(peVar10,"VarKind",VarKind,(char *)0x0);
  peVar10 = pybind11::enum_<kratos::IRNodeKind>::value(peVar10,"StmtKind",StmtKind,(char *)0x0);
  pybind11::detail::enum_base::export_values(&peVar10->m_base);
  pybind11::object::~object((object *)&cf);
  pybind11::enum_<kratos::VarCastType>::enum_<>
            ((enum_<kratos::VarCastType> *)&cf,(handle *)m,"VarCastType");
  peVar11 = pybind11::enum_<kratos::VarCastType>::value
                      ((enum_<kratos::VarCastType> *)&cf,"Signed",Signed,(char *)0x0);
  peVar11 = pybind11::enum_<kratos::VarCastType>::value(peVar11,"Unsigned",Unsigned,(char *)0x0);
  peVar11 = pybind11::enum_<kratos::VarCastType>::value(peVar11,"AsyncReset",AsyncReset,(char *)0x0)
  ;
  peVar11 = pybind11::enum_<kratos::VarCastType>::value
                      (peVar11,"ClockEnable",ClockEnable,(char *)0x0);
  peVar11 = pybind11::enum_<kratos::VarCastType>::value(peVar11,"Clock",Clock,(char *)0x0);
  peVar11 = pybind11::enum_<kratos::VarCastType>::value(peVar11,"Enum",Enum,(char *)0x0);
  pybind11::enum_<kratos::VarCastType>::value(peVar11,"Resize",Resize,(char *)0x0);
  pybind11::object::~object((object *)&cf);
  pybind11::enum_<kratos::PropertyAction>::enum_<>
            ((enum_<kratos::PropertyAction> *)&cf,(handle *)m,"PropertyAction");
  peVar12 = pybind11::enum_<kratos::PropertyAction>::value
                      ((enum_<kratos::PropertyAction> *)&cf,"None",None,(char *)0x0);
  peVar12 = pybind11::enum_<kratos::PropertyAction>::value(peVar12,"Cover",Cover,(char *)0x0);
  peVar12 = pybind11::enum_<kratos::PropertyAction>::value(peVar12,"Assume",Assume,(char *)0x0);
  pybind11::enum_<kratos::PropertyAction>::value(peVar12,"Assert",Assert,(char *)0x0);
  pybind11::object::~object((object *)&cf);
  pybind11::enum_<kratos::ParamType>::enum_<>
            ((enum_<kratos::ParamType> *)&cf,(handle *)m,"ParamType");
  peVar13 = pybind11::enum_<kratos::ParamType>::value
                      ((enum_<kratos::ParamType> *)&cf,"RawType",RawType,(char *)0x0);
  peVar13 = pybind11::enum_<kratos::ParamType>::value(peVar13,"Parameter",Parameter,(char *)0x0);
  peVar13 = pybind11::enum_<kratos::ParamType>::value(peVar13,"Enum",Enum,(char *)0x0);
  pybind11::enum_<kratos::ParamType>::value(peVar13,"Integral",Integral,(char *)0x0);
  pybind11::object::~object((object *)&cf);
  pybind11::enum_<kratos::AuxiliaryType>::enum_<>
            ((enum_<kratos::AuxiliaryType> *)&cf,(handle *)m,"AuxiliaryType");
  pybind11::enum_<kratos::AuxiliaryType>::value
            ((enum_<kratos::AuxiliaryType> *)&cf,"Event",EventTracing,(char *)0x0);
  pybind11::object::~object((object *)&cf);
  pybind11::enum_<kratos::EventActionType>::enum_<>
            ((enum_<kratos::EventActionType> *)&cf,(handle *)m,"EventActionType");
  peVar14 = pybind11::enum_<kratos::EventActionType>::value
                      ((enum_<kratos::EventActionType> *)&cf,"None_",None,(char *)0x0);
  peVar14 = pybind11::enum_<kratos::EventActionType>::value(peVar14,"Start",Start,(char *)0x0);
  pybind11::enum_<kratos::EventActionType>::value(peVar14,"End",End,(char *)0x0);
  pybind11::object::~object((object *)&cf);
  pybind11::enum_<kratos::EventControl::DelaySide>::enum_<>
            ((enum_<kratos::EventControl::DelaySide> *)&cf,(handle *)m,"DelaySide");
  this = pybind11::enum_<kratos::EventControl::DelaySide>::value
                   ((enum_<kratos::EventControl::DelaySide> *)&cf,"Left",left,(char *)0x0);
  pybind11::enum_<kratos::EventControl::DelaySide>::value(this,"Right",right,(char *)0x0);
  pybind11::object::~object((object *)&cf);
  return;
}

Assistant:

void init_enum(py::module &m) {
    using namespace kratos;
    py::enum_<PortType>(m, "PortType")
        .value("Clock", PortType::Clock)
        .value("AsyncReset", PortType::AsyncReset)
        .value("ClockEnable", PortType::ClockEnable)
        .value("Data", PortType::Data)
        .value("Reset", PortType::Reset)
        .export_values();

    py::enum_<PortDirection>(m, "PortDirection")
        .value("In", PortDirection::In)
        .value("Out", PortDirection::Out)
        .value("InOut", PortDirection::InOut)
        .export_values();

    py::enum_<HashStrategy>(m, "HashStrategy")
        .value("SequentialHash", HashStrategy::SequentialHash)
        .value("ParallelHash", HashStrategy::ParallelHash)
        .export_values();

    py::enum_<StatementType>(m, "StatementType")
        .value("If", StatementType::If)
        .value("Switch", StatementType::Switch)
        .value("Assign", StatementType::Assign)
        .value("Block", StatementType::Block)
        .value("ModuleInstantiation", StatementType::ModuleInstantiation)
        .export_values();

    py::enum_<AssignmentType>(m, "AssignmentType")
        .value("Blocking", AssignmentType::Blocking)
        .value("NonBlocking", AssignmentType::NonBlocking)
        .value("Undefined", AssignmentType::Undefined)
        .export_values();

    py::enum_<StatementBlockType>(m, "StatementBlockType")
        .value("Combinational", StatementBlockType::Combinational)
        .value("Sequential", StatementBlockType::Sequential)
        .value("Initial", StatementBlockType::Initial)
        .value("Latch", StatementBlockType::Latch)
        .value("Final", StatementBlockType::Final)
        .export_values();

    py::enum_<EventEdgeType>(m, "EventEdgeType")
        .value("Posedge", EventEdgeType::Posedge)
        .value("Negedge", EventEdgeType::Negedge)
        .def("__call__", [](EventEdgeType type, Var &var) {
            auto event = EventControl(type, var);
            auto stmt = std::make_shared<EventDelayStmt>(event);
            return stmt;
        });

    py::enum_<IRNodeKind>(m, "IRNodeKind")
        .value("GeneratorKind", IRNodeKind::GeneratorKind)
        .value("VarKind", IRNodeKind::VarKind)
        .value("StmtKind", IRNodeKind::StmtKind)
        .export_values();

    py::enum_<VarCastType>(m, "VarCastType")
        .value("Signed", VarCastType::Signed)
        .value("Unsigned", VarCastType::Unsigned)
        .value("AsyncReset", VarCastType::AsyncReset)
        .value("ClockEnable", VarCastType::ClockEnable)
        .value("Clock", VarCastType::Clock)
        .value("Enum", VarCastType::Enum)
        .value("Resize", VarCastType::Resize);

    py::enum_<PropertyAction>(m, "PropertyAction")
        .value("None", PropertyAction::None)
        .value("Cover", PropertyAction::Cover)
        .value("Assume", PropertyAction::Assume)
        .value("Assert", PropertyAction::Assert);

    py::enum_<ParamType>(m, "ParamType")
        .value("RawType", ParamType::RawType)
        .value("Parameter", ParamType::Parameter)
        .value("Enum", ParamType::Enum)
        .value("Integral", ParamType::Integral);

    py::enum_<AuxiliaryType>(m, "AuxiliaryType").value("Event", AuxiliaryType::EventTracing);

    py::enum_<EventActionType>(m, "EventActionType")
        .value("None_", EventActionType::None)
        .value("Start", EventActionType::Start)
        .value("End", EventActionType::End);

    py::enum_<EventControl::DelaySide>(m, "DelaySide")
        .value("Left", EventControl::DelaySide::left)
        .value("Right", EventControl::DelaySide::right);
}